

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O1

string * __thiscall
cmJSONState::GetJsonContext_abi_cxx11_
          (string *__return_storage_ptr__,cmJSONState *this,Location loc)

{
  uint uVar1;
  ulong uVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string line;
  stringstream sstream;
  long *local_2c8;
  undefined8 local_2c0;
  long local_2b8 [2];
  char *local_2a8;
  size_t local_2a0;
  char local_298;
  undefined7 uStack_297;
  undefined8 local_288;
  undefined8 local_280;
  undefined1 *local_278;
  undefined1 local_270 [32];
  undefined8 local_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [392];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  long *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  local_2a0 = 0;
  local_298 = '\0';
  local_2a8 = &local_298;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_218,(string *)&this->doc,_S_out|_S_in);
  if (0 < loc.line) {
    uVar2 = (ulong)loc & 0xffffffff;
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_218,(string *)&local_2a8,'\n');
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct
            ((ulong)&local_2c8,(char)((ulong)((long)loc + -0x100000000) >> 0x20));
  local_90.first._M_len = local_2a0;
  local_90.first._M_str = local_2a8;
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_240 = local_238;
  local_250 = 0;
  local_248 = 1;
  local_238[0] = 10;
  local_78 = 1;
  local_68 = 0;
  local_60 = local_2c0;
  local_58 = local_2c8;
  local_278 = local_270;
  local_288 = 0;
  local_280 = 1;
  local_270[0] = 0x5e;
  local_48 = 1;
  local_38 = 0;
  views._M_len = 4;
  views._M_array = &local_90;
  local_70 = local_240;
  local_50 = (undefined1 *)&local_2c8;
  local_40 = local_278;
  cmCatViews(__return_storage_ptr__,views);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x80));
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJSONState::GetJsonContext(Location loc)
{
  std::string line;
  std::stringstream sstream(doc);
  for (int i = 0; i < loc.line; ++i) {
    std::getline(sstream, line, '\n');
  }
  return cmStrCat(line, '\n', std::string(loc.column - 1, ' '), '^');
}